

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O3

vector<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_> * __thiscall
LZ77Compressor::compress(LZ77Compressor *this,uint8_t *input,int inputLength)

{
  int end;
  pointer *ppIVar1;
  pointer pIVar2;
  long lVar3;
  iterator __position;
  long lVar4;
  int maxLen;
  int i;
  int local_3c;
  Item local_38;
  
  pIVar2 = (this->output).
           super__Vector_base<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->output).super__Vector_base<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_>
      ._M_impl.super__Vector_impl_data._M_finish != pIVar2) {
    (this->output).super__Vector_base<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_>.
    _M_impl.super__Vector_impl_data._M_finish = pIVar2;
  }
  lVar4 = 0x28;
  do {
    lVar3 = *(long *)((long)this->dict + lVar4 + -0x28);
    if (*(long *)((long)this->dict + lVar4 + -0x20) != lVar3) {
      *(long *)((long)this->dict + lVar4 + -0x20) = lVar3;
    }
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x6028);
  local_3c = 0;
  maxLen = this->maxMatch;
  end = inputLength + -2;
  if (maxLen < inputLength) {
    do {
      next(this,input,&local_3c,maxLen,end);
      maxLen = this->maxMatch;
    } while (local_3c < inputLength - maxLen);
  }
  if (local_3c < end) {
    do {
      next(this,input,&local_3c,inputLength - local_3c,end);
    } while (local_3c < end);
  }
  if (local_3c < inputLength) {
    do {
      local_38.field_1.field_1.offset = 0;
      local_38._0_4_ = (uint)input[local_3c] << 0x10;
      __position._M_current =
           (this->output).
           super__Vector_base<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->output).
          super__Vector_base<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<LZ77Compressor::Item,std::allocator<LZ77Compressor::Item>>::
        _M_realloc_insert<LZ77Compressor::Item_const&>
                  ((vector<LZ77Compressor::Item,std::allocator<LZ77Compressor::Item>> *)
                   &this->output,__position,&local_38);
      }
      else {
        ((__position._M_current)->field_1).field_1.offset = 0;
        *(undefined4 *)__position._M_current = local_38._0_4_;
        ppIVar1 = &(this->output).
                   super__Vector_base<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppIVar1 = *ppIVar1 + 1;
      }
      local_3c = local_3c + 1;
    } while (local_3c < inputLength);
  }
  return &this->output;
}

Assistant:

const std::vector<Item>& compress(const uint8_t* input, int inputLength) {
		clear();
		int i = 0;
		int matchOff, matchLen;
		while (i < inputLength - maxMatch) {
			next(input, i, maxMatch, inputLength - 2);
		}
		while (i < inputLength - 2) {
			next(input, i, inputLength - i, inputLength - 2);
		}
		for (; i < inputLength; i++) {
			Item item = {0};
			item.isRepeat = false;
			item.value = input[i];
			output.push_back(item);
		}
		return output;
	}